

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_dr_prediction_z3_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int base_inc;
  int frac_bits;
  int max_base_y;
  int val;
  int shift;
  int base;
  int y;
  int c;
  int r;
  uint8_t *left_local;
  uint8_t *above_local;
  int bh_local;
  int bw_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  bVar3 = (byte)upsample_left;
  iVar1 = bw + bh + -1 << (bVar3 & 0x1f);
  y = dy;
  c = 0;
LAB_006de4e9:
  if (bw <= c) {
    return;
  }
  base = y >> (6 - bVar3 & 0x1f);
  iVar2 = (int)(y << (bVar3 & 0x1f) & 0x3fU) >> 1;
  for (r = 0; r < bh; r = r + 1) {
    if (iVar1 <= base) goto LAB_006de59b;
    dst[r * stride + (long)c] =
         (uint8_t)((int)((uint)left[base] * (0x20 - iVar2) + (uint)left[base + 1] * iVar2 + 0x10) >>
                  5);
    base = (1 << (bVar3 & 0x1f)) + base;
  }
  goto LAB_006de5fc;
LAB_006de59b:
  for (; r < bh; r = r + 1) {
    dst[r * stride + (long)c] = left[iVar1];
  }
LAB_006de5fc:
  c = c + 1;
  y = dy + y;
  goto LAB_006de4e9;
}

Assistant:

void av1_dr_prediction_z3_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_left, int dx, int dy) {
  int r, c, y, base, shift, val;

  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);

  const int max_base_y = (bw + bh - 1) << upsample_left;
  const int frac_bits = 6 - upsample_left;
  const int base_inc = 1 << upsample_left;
  y = dy;
  for (c = 0; c < bw; ++c, y += dy) {
    base = y >> frac_bits;
    shift = ((y << upsample_left) & 0x3F) >> 1;

    for (r = 0; r < bh; ++r, base += base_inc) {
      if (base < max_base_y) {
        val = left[base] * (32 - shift) + left[base + 1] * shift;
        dst[r * stride + c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        for (; r < bh; ++r) dst[r * stride + c] = left[max_base_y];
        break;
      }
    }
  }
}